

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int setContext(XML_Parser parser,XML_Char *context)

{
  STRING_POOL *pool;
  char cVar1;
  int iVar2;
  NAMED *pNVar3;
  PREFIX *prefix;
  XML_Char *pXVar4;
  undefined1 *puVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (*context != '\0') {
    pool = (STRING_POOL *)((long)parser + 0x418);
    pcVar6 = context;
    do {
      cVar1 = *pcVar6;
      if (cVar1 == '\0') {
LAB_0014caaa:
        puVar5 = *(undefined1 **)((long)parser + 0x430);
        if (puVar5 == *(undefined1 **)((long)parser + 0x428)) {
          iVar2 = poolGrow(pool);
          if (iVar2 == 0) {
            return 0;
          }
          puVar5 = *(undefined1 **)((long)parser + 0x430);
        }
        *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
        *puVar5 = 0;
        pNVar3 = lookup((HASH_TABLE *)((long)parser + 0x290),*(KEY *)((long)parser + 0x438),0);
        if (pNVar3 != (NAMED *)0x0) {
          *(undefined1 *)&pNVar3[7].name = 1;
        }
        cVar1 = *pcVar6;
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        context = pcVar6 + (cVar1 != '\0');
        pcVar6 = pcVar6 + (cVar1 != '\0');
      }
      else if (cVar1 == '=') {
        puVar5 = *(undefined1 **)((long)parser + 0x430);
        prefix = (PREFIX *)((long)parser + 0x390);
        if (puVar5 != *(undefined1 **)((long)parser + 0x438)) {
          if (puVar5 == *(undefined1 **)((long)parser + 0x428)) {
            iVar2 = poolGrow(pool);
            if (iVar2 == 0) {
              return 0;
            }
            puVar5 = *(undefined1 **)((long)parser + 0x430);
          }
          *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
          *puVar5 = 0;
          prefix = (PREFIX *)
                   lookup((HASH_TABLE *)((long)parser + 0x308),*(KEY *)((long)parser + 0x438),0x10);
          if (prefix == (PREFIX *)0x0) {
            return 0;
          }
          pXVar4 = *(XML_Char **)((long)parser + 0x438);
          if (prefix->name == pXVar4) {
            pXVar4 = poolCopyString((STRING_POOL *)((long)parser + 0x330),prefix->name);
            prefix->name = pXVar4;
            if (pXVar4 == (XML_Char *)0x0) {
              return 0;
            }
            pXVar4 = *(XML_Char **)((long)parser + 0x438);
          }
          *(XML_Char **)((long)parser + 0x430) = pXVar4;
        }
        while( true ) {
          pcVar7 = pcVar6 + 1;
          cVar1 = *pcVar7;
          if ((cVar1 == '\0') || (cVar1 == '\f')) break;
          pcVar6 = *(char **)((long)parser + 0x430);
          if (pcVar6 == *(char **)((long)parser + 0x428)) {
            iVar2 = poolGrow(pool);
            if (iVar2 == 0) {
              return 0;
            }
            cVar1 = *pcVar7;
            pcVar6 = *(char **)((long)parser + 0x430);
          }
          *(char **)((long)parser + 0x430) = pcVar6 + 1;
          *pcVar6 = cVar1;
          pcVar6 = pcVar7;
        }
        puVar5 = *(undefined1 **)((long)parser + 0x430);
        if (puVar5 == *(undefined1 **)((long)parser + 0x428)) {
          iVar2 = poolGrow(pool);
          if (iVar2 == 0) {
            return 0;
          }
          puVar5 = *(undefined1 **)((long)parser + 0x430);
        }
        *(undefined1 **)((long)parser + 0x430) = puVar5 + 1;
        *puVar5 = 0;
        iVar2 = addBinding(parser,prefix,(ATTRIBUTE_ID *)0x0,*(XML_Char **)((long)parser + 0x438),
                           (BINDING **)((long)parser + 0x3e0));
        if (iVar2 == 0) {
          return 0;
        }
        *(undefined8 *)((long)parser + 0x430) = *(undefined8 *)((long)parser + 0x438);
        context = pcVar6 + 2;
        pcVar6 = pcVar6 + 2;
        if (*pcVar7 == '\0') {
          context = pcVar7;
          pcVar6 = pcVar7;
        }
      }
      else {
        if (cVar1 == '\f') goto LAB_0014caaa;
        pcVar7 = *(char **)((long)parser + 0x430);
        if (pcVar7 == *(char **)((long)parser + 0x428)) {
          iVar2 = poolGrow(pool);
          if (iVar2 == 0) {
            return 0;
          }
          cVar1 = *pcVar6;
          pcVar7 = *(char **)((long)parser + 0x430);
        }
        *(char **)((long)parser + 0x430) = pcVar7 + 1;
        *pcVar7 = cVar1;
        pcVar6 = pcVar6 + 1;
      }
    } while (*context != '\0');
  }
  return 1;
}

Assistant:

static
int setContext(XML_Parser parser, const XML_Char *context)
{
  const XML_Char *s = context;

  while (*context != XML_T('\0')) {
    if (*s == CONTEXT_SEP || *s == XML_T('\0')) {
      ENTITY *e;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      e = (ENTITY *)lookup(&dtd.generalEntities, poolStart(&tempPool), 0);
      if (e)
        e->open = 1;
      if (*s != XML_T('\0'))
        s++;
      context = s;
      poolDiscard(&tempPool);
    }
    else if (*s == '=') {
      PREFIX *prefix;
      if (poolLength(&tempPool) == 0)
        prefix = &dtd.defaultPrefix;
      else {
        if (!poolAppendChar(&tempPool, XML_T('\0')))
          return 0;
        prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&tempPool), sizeof(PREFIX));
        if (!prefix)
          return 0;
        if (prefix->name == poolStart(&tempPool)) {
          prefix->name = poolCopyString(&dtd.pool, prefix->name);
          if (!prefix->name)
            return 0;
        }
        poolDiscard(&tempPool);
      }
      for (context = s + 1; *context != CONTEXT_SEP && *context != XML_T('\0'); context++)
        if (!poolAppendChar(&tempPool, *context))
          return 0;
      if (!poolAppendChar(&tempPool, XML_T('\0')))
        return 0;
      if (!addBinding(parser, prefix, 0, poolStart(&tempPool), &inheritedBindings))
        return 0;
      poolDiscard(&tempPool);
      if (*context != XML_T('\0'))
        ++context;
      s = context;
    }
    else {
      if (!poolAppendChar(&tempPool, *s))
        return 0;
      s++;
    }
  }
  return 1;
}